

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I420ToI400(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  undefined8 in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  undefined4 unaff_retaddr;
  int in_stack_00000020;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDI == (uint8_t *)0x0) || (src_v == (uint8_t *)0x0)) || ((int)src_u < 1)) ||
     (in_stack_00000020 == 0)) {
    iVar1 = -1;
  }
  else {
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      in_RDI = in_RDI + (in_stack_00000020 + -1) * in_ESI;
      in_ESI = -in_ESI;
    }
    CopyPlane((uint8_t *)CONCAT44(src_stride_v,unaff_retaddr),in_stack_fffffffffffffffc,in_RDI,
              in_ESI,in_stack_ffffffffffffffe8,(int)((ulong)in_RDX >> 0x20));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420ToI400(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_u,
               int src_stride_u,
               const uint8_t* src_v,
               int src_stride_v,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  (void)src_u;
  (void)src_stride_u;
  (void)src_v;
  (void)src_stride_v;
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }

  CopyPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  return 0;
}